

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_history_item.cc
# Opt level: O2

void hanabi_learning_env::ChangeToObserverRelative
               (int observer_pid,int player_count,HanabiHistoryItem *item)

{
  byte bVar1;
  char cVar2;
  uint __line;
  char *__assertion;
  
  bVar1 = item->player;
  if ((item->move).move_type_ == kDeal) {
    if ((-1 < (char)bVar1) || (item->deal_to_player < '\0')) {
      __assertion = "item->player < 0 && item->deal_to_player >= 0";
      __line = 0x3d;
LAB_001182ca:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/hanabi_lib/hanabi_history_item.cc"
                    ,__line,
                    "void hanabi_learning_env::ChangeToObserverRelative(int, int, HanabiHistoryItem *)"
                   );
    }
    cVar2 = (char)(((player_count - observer_pid) + (int)item->deal_to_player) % player_count);
    item->deal_to_player = cVar2;
    if (cVar2 == '\0') {
      (item->move).move_type_ = kDeal;
      (item->move).card_index_ = -1;
      (item->move).target_offset_ = -1;
      (item->move).color_ = -1;
      (item->move).rank_ = -1;
    }
  }
  else {
    if ((char)bVar1 < '\0') {
      __assertion = "item->player >= 0";
      __line = 0x45;
      goto LAB_001182ca;
    }
    item->player = (int8_t)((int)((player_count - observer_pid) + (uint)bVar1) % player_count);
  }
  return;
}

Assistant:

void ChangeToObserverRelative(int observer_pid, int player_count,
                              HanabiHistoryItem* item) {
  if (item->move.MoveType() == HanabiMove::kDeal) {
    assert(item->player < 0 && item->deal_to_player >= 0);
    item->deal_to_player =
        (item->deal_to_player - observer_pid + player_count) % player_count;
    if (item->deal_to_player == 0) {
      // Hide cards dealt to observer.
      item->move = HanabiMove(HanabiMove::kDeal, -1, -1, -1, -1);
    }
  } else {
    assert(item->player >= 0);
    item->player = (item->player - observer_pid + player_count) % player_count;
  }
}